

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataRefs.cpp
# Opt level: O1

vectorTy * __thiscall
DataRefs::GetSimWind(vectorTy *__return_storage_ptr__,DataRefs *this,double alt_m)

{
  pointer pWVar1;
  pointer pWVar2;
  pointer pWVar3;
  long lVar4;
  pointer pWVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  
  pWVar1 = (this->lastWind).
           super__Vector_base<DataRefs::WindLayerTy,_std::allocator<DataRefs::WindLayerTy>_>._M_impl
           .super__Vector_impl_data._M_start;
  pWVar2 = (this->lastWind).
           super__Vector_base<DataRefs::WindLayerTy,_std::allocator<DataRefs::WindLayerTy>_>._M_impl
           .super__Vector_impl_data._M_finish;
  if (pWVar1 == pWVar2) {
    dVar7 = 0.0;
    dVar6 = 0.0;
    goto LAB_00133058;
  }
  if ((!NAN(alt_m) && (long)pWVar2 - (long)pWVar1 != 0x18) && (pWVar1->alt_m < alt_m)) {
    lVar4 = ((long)pWVar2 - (long)pWVar1 >> 3) * -0x5555555555555555 >> 2;
    pWVar3 = pWVar1;
    if (0 < lVar4) {
      pWVar3 = pWVar1 + lVar4 * 4;
      lVar4 = lVar4 + 1;
      pWVar5 = pWVar1 + 2;
      do {
        if (alt_m <= pWVar5[-2].alt_m) {
          pWVar5 = pWVar5 + -2;
          goto LAB_00132fd0;
        }
        if (alt_m <= pWVar5[-1].alt_m) {
          pWVar5 = pWVar5 + -1;
          goto LAB_00132fd0;
        }
        if (alt_m <= pWVar5->alt_m) goto LAB_00132fd0;
        if (alt_m <= pWVar5[1].alt_m) {
          pWVar5 = pWVar5 + 1;
          goto LAB_00132fd0;
        }
        lVar4 = lVar4 + -1;
        pWVar5 = pWVar5 + 4;
      } while (1 < lVar4);
    }
    lVar4 = ((long)pWVar2 - (long)pWVar3 >> 3) * -0x5555555555555555;
    if (lVar4 == 1) {
LAB_00132fa0:
      pWVar5 = pWVar3;
      if (pWVar3->alt_m < alt_m) {
        pWVar5 = pWVar2;
      }
    }
    else if (lVar4 == 2) {
LAB_00132f92:
      pWVar5 = pWVar3;
      if (pWVar3->alt_m < alt_m) {
        pWVar3 = pWVar3 + 1;
        goto LAB_00132fa0;
      }
    }
    else {
      pWVar5 = pWVar2;
      if ((lVar4 == 3) && (pWVar5 = pWVar3, pWVar3->alt_m < alt_m)) {
        pWVar3 = pWVar3 + 1;
        goto LAB_00132f92;
      }
    }
LAB_00132fd0:
    if (pWVar5 == pWVar2) {
      dVar7 = pWVar2[-1].spd_msc;
      dVar6 = pWVar2[-1].dir_degt;
      goto LAB_00133058;
    }
    if (pWVar5 != pWVar1) {
      dVar8 = (alt_m - pWVar5[-1].alt_m) / (pWVar5->alt_m - pWVar5[-1].alt_m);
      dVar7 = (1.0 - dVar8) * pWVar5[-1].spd_msc + pWVar5->spd_msc * dVar8;
      dVar6 = HeadingDiff(pWVar5[-1].dir_degt,pWVar5->dir_degt);
      dVar6 = HeadingNormalize(dVar6 * dVar8 + pWVar5[-1].dir_degt);
      goto LAB_00133058;
    }
  }
  dVar7 = pWVar1->spd_msc;
  dVar6 = pWVar1->dir_degt;
LAB_00133058:
  __return_storage_ptr__->angle = dVar6;
  __return_storage_ptr__->dist = NAN;
  __return_storage_ptr__->vsi = NAN;
  __return_storage_ptr__->speed = dVar7;
  return __return_storage_ptr__;
}

Assistant:

const vectorTy DataRefs::GetSimWind (double alt_m) const
{
    // No wind layers known? -> return "no wind"
    if (lastWind.empty())
        return vectorTy(0.0, NAN, NAN, 0.0);
    // Just one wind layer? Or plane is lower than first layer? -> return first layer's wind
    if (lastWind.size() == 1 || std::isnan(alt_m) || alt_m <= lastWind[0].alt_m)
        return vectorTy(lastWind.front().dir_degt, NAN, NAN, lastWind.front().spd_msc);
    // More than one layer and plane is flying higher than first layer
    // Find the fist layer, which is higher than the plane
    auto iter = std::find_if(lastWind.cbegin(), lastWind.cend(),
                             [alt_m](const WindLayerTy& wl){ return alt_m <= wl.alt_m; });
    // If not found, then plane is flying higher than highest layer -> return highest wind
    if (iter == lastWind.cend())
        return vectorTy(lastWind.back().dir_degt, NAN, NAN, lastWind.back().spd_msc);
    // else we found a higher wind layer, but is it right away the first?
    // (should not happen...but just to be on the safe side we catch the case)
    if (iter == lastWind.cbegin())
        return vectorTy(lastWind.front().dir_degt, NAN, NAN, lastWind.front().spd_msc);
    // Now really...plane is in the middle between two layers
    // return an average value between them
    const WindLayerTy& low = *std::prev(iter);
    const WindLayerTy& hgh = *iter;
    const double f = (alt_m - low.alt_m) / (hgh.alt_m - low.alt_m);     // factor how much to use the higher value, should be between 0 and 1
    const double spd = (1.0-f) * low.spd_msc + f * hgh.spd_msc;         // average of speed
    const double hdg_diff = HeadingDiff(low.dir_degt, hgh.dir_degt);    // heading diff
    const double hdg = low.dir_degt + f*hdg_diff;                       // "average" of heading
    return vectorTy(HeadingNormalize(hdg), NAN, NAN, spd);
}